

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

ShaderExecutor *
deqp::gls::ShaderExecUtil::createExecutor
          (RenderContext *renderCtx,ShaderType shaderType,ShaderSpec *shaderSpec)

{
  VertexShaderExecutor *this;
  FragmentShaderExecutor *this_00;
  ComputeShaderExecutor *this_01;
  InternalError *this_02;
  allocator<char> local_59;
  string local_58;
  ShaderSpec *local_28;
  ShaderSpec *shaderSpec_local;
  RenderContext *pRStack_18;
  ShaderType shaderType_local;
  RenderContext *renderCtx_local;
  
  local_28 = shaderSpec;
  shaderSpec_local._4_4_ = shaderType;
  pRStack_18 = renderCtx;
  switch(shaderType) {
  case SHADERTYPE_VERTEX:
    this = (VertexShaderExecutor *)operator_new(0x158);
    VertexShaderExecutor::VertexShaderExecutor(this,pRStack_18,local_28);
    renderCtx_local = (RenderContext *)this;
    break;
  case SHADERTYPE_FRAGMENT:
    this_00 = (FragmentShaderExecutor *)operator_new(0x158);
    FragmentShaderExecutor::FragmentShaderExecutor(this_00,pRStack_18,local_28);
    renderCtx_local = (RenderContext *)this_00;
    break;
  case SHADERTYPE_GEOMETRY:
    renderCtx_local = (RenderContext *)GeometryShaderExecutor::create(renderCtx,shaderSpec);
    break;
  case SHADERTYPE_TESSELLATION_CONTROL:
    renderCtx_local = (RenderContext *)TessControlExecutor::create(renderCtx,shaderSpec);
    break;
  case SHADERTYPE_TESSELLATION_EVALUATION:
    renderCtx_local = (RenderContext *)TessEvaluationExecutor::create(renderCtx,shaderSpec);
    break;
  case SHADERTYPE_COMPUTE:
    this_01 = (ComputeShaderExecutor *)operator_new(0x180);
    ComputeShaderExecutor::ComputeShaderExecutor(this_01,pRStack_18,local_28);
    renderCtx_local = (RenderContext *)this_01;
    break;
  default:
    this_02 = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Unsupported shader type",&local_59);
    tcu::InternalError::InternalError(this_02,&local_58);
    __cxa_throw(this_02,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  return (ShaderExecutor *)renderCtx_local;
}

Assistant:

ShaderExecutor* createExecutor (const glu::RenderContext& renderCtx, glu::ShaderType shaderType, const ShaderSpec& shaderSpec)
{
	switch (shaderType)
	{
		case glu::SHADERTYPE_VERTEX:					return new VertexShaderExecutor			(renderCtx, shaderSpec);
		case glu::SHADERTYPE_TESSELLATION_CONTROL:		return TessControlExecutor::create		(renderCtx, shaderSpec);
		case glu::SHADERTYPE_TESSELLATION_EVALUATION:	return TessEvaluationExecutor::create	(renderCtx, shaderSpec);
		case glu::SHADERTYPE_GEOMETRY:					return GeometryShaderExecutor::create	(renderCtx, shaderSpec);
		case glu::SHADERTYPE_FRAGMENT:					return new FragmentShaderExecutor		(renderCtx, shaderSpec);
		case glu::SHADERTYPE_COMPUTE:					return new ComputeShaderExecutor		(renderCtx, shaderSpec);
		default:
			throw tcu::InternalError("Unsupported shader type");
	}
}